

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

void __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          long *cur,char *end)

{
  char cVar1;
  char *pcVar2;
  size_t __n;
  size_type index;
  undefined1 *__s2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  long lVar6;
  bool bVar7;
  string_type name;
  regex_error local_a8;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  source_location local_48;
  
  pcVar2 = (char *)*cur;
  if ((pcVar2 == end) || (*cur = (long)(pcVar2 + 1), *pcVar2 != '<')) {
    std::runtime_error::runtime_error(&local_a8.super_runtime_error,"invalid named back-reference");
    local_a8.super_exception.data_.px_ = (error_info_container *)0x0;
    local_a8._0_8_ = &PTR__regex_error_00195328;
    local_a8.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
    local_a8.code_ = error_badmark;
    local_a8.super_exception.throw_function_ =
         "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
    ;
    local_a8.super_exception.throw_file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
    ;
    local_a8.super_exception.throw_line_ = 0x530;
    local_a8.super_exception.throw_column_ = -1;
    throw_exception<boost::xpressive::regex_error>(&local_a8);
  }
  pcVar2 = (char *)*cur;
  bVar7 = pcVar2 == end;
  pcVar4 = pcVar2;
  if (!bVar7) {
    cVar1 = *pcVar2;
    while (cVar1 != '>') {
      pcVar4 = pcVar4 + 1;
      *cur = (long)pcVar4;
      bVar7 = pcVar4 == end;
      if (bVar7) break;
      cVar1 = *pcVar4;
    }
  }
  if (((pcVar4 == pcVar2) || (bVar7)) || (*pcVar4 != '>')) {
    std::runtime_error::runtime_error(&local_a8.super_runtime_error,"invalid named back-reference");
    local_a8.super_exception.data_.px_ = (error_info_container *)0x0;
    local_a8._0_8_ = &PTR__regex_error_00195328;
    local_a8.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
    local_a8.code_ = error_badmark;
    local_a8.super_exception.throw_function_ =
         "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
    ;
    local_a8.super_exception.throw_file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
    ;
    local_a8.super_exception.throw_line_ = 0x535;
    local_a8.super_exception.throw_column_ = -1;
    throw_exception<boost::xpressive::regex_error>(&local_a8);
  }
  *cur = (long)(pcVar4 + 1);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_68,pcVar2);
  __s2 = local_68;
  puVar5 = *(undefined8 **)(this + 0xb8);
  if (*(long *)(this + 0xc0) - (long)puVar5 != 0) {
    lVar6 = (*(long *)(this + 0xc0) - (long)puVar5 >> 3) * -0x3333333333333333;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    do {
      __n = puVar5[1];
      if ((__n == local_60) && ((__n == 0 || (iVar3 = bcmp((void *)*puVar5,__s2,__n), iVar3 == 0))))
      {
        index = puVar5[4];
        detail::
        sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(this + 8),index);
        detail::
        sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(this + 8),index);
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        return;
      }
      puVar5 = puVar5 + 5;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  std::runtime_error::runtime_error(&local_a8.super_runtime_error,"invalid named back-reference");
  local_a8.super_exception.data_.px_ = (error_info_container *)0x0;
  local_a8.super_exception.throw_function_ = (char *)0x0;
  local_a8.super_exception.throw_file_ = (char *)0x0;
  local_a8.super_exception.throw_line_ = -1;
  local_a8.super_exception.throw_column_ = -1;
  local_a8._0_8_ = &PTR__regex_error_00195328;
  local_a8.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
  local_a8.code_ = error_badmark;
  local_48.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
  ;
  local_48.function_ =
       "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
  ;
  local_48.line_ = 0x541;
  local_48.column_ = 0;
  throw_exception<boost::xpressive::regex_error>(&local_a8,&local_48);
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }